

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuEvent>::emplace<QDBusMenuEvent_const&>
          (QMovableArrayOps<QDBusMenuEvent> *this,qsizetype i,QDBusMenuEvent *args)

{
  QDBusMenuEvent **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QDBusMenuEvent *pQVar5;
  Data *pDVar6;
  QArrayData *pQVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QDBusMenuEvent tmp;
  Inserter local_a0;
  int local_78;
  undefined4 uStack_74;
  QArrayData *pQStack_70;
  char16_t *local_68;
  qsizetype qStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0064ca53:
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    _local_78 = CONCAT44(0xaaaaaaaa,args->m_id);
    pQStack_70 = &((args->m_eventId).d.d)->super_QArrayData;
    local_68 = (args->m_eventId).d.ptr;
    qStack_60 = (args->m_eventId).d.size;
    if (pQStack_70 != (QArrayData *)0x0) {
      LOCK();
      (((Data *)pQStack_70)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)pQStack_70)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ::QVariant::QVariant((QVariant *)&local_58,&(args->m_data).m_variant);
    local_38 = (undefined1 *)CONCAT44(local_38._4_4_,args->m_timestamp);
    bVar10 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
             size != 0;
    QArrayDataPointer<QDBusMenuEvent>::detachAndGrow
              ((QArrayDataPointer<QDBusMenuEvent> *)this,(uint)(i == 0 && bVar10),1,
               (QDBusMenuEvent **)0x0,(QArrayDataPointer<QDBusMenuEvent> *)0x0);
    qVar9 = qStack_60;
    pcVar8 = local_68;
    pQVar7 = pQStack_70;
    if (i == 0 && bVar10) {
      pQVar5 = (this->super_QGenericArrayOps<QDBusMenuEvent>).
               super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      pQVar5[-1].m_id = local_78;
      pQStack_70 = (QArrayData *)0x0;
      pQVar5[-1].m_eventId.d.d = (Data *)pQVar7;
      local_68 = (char16_t *)0x0;
      pQVar5[-1].m_eventId.d.ptr = pcVar8;
      qStack_60 = 0;
      pQVar5[-1].m_eventId.d.size = qVar9;
      *(undefined8 *)((long)&pQVar5[-1].m_data.m_variant.d.data + 0x10) = local_58._16_8_;
      *(undefined1 **)&pQVar5[-1].m_data.m_variant.d.field_0x18 = puStack_40;
      pQVar5[-1].m_data.m_variant.d.data.shared = local_58.shared;
      *(undefined8 *)((long)&pQVar5[-1].m_data.m_variant.d.data + 8) = local_58._8_8_;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      puStack_40 = (undefined1 *)0x2;
      pQVar5[-1].m_timestamp = (uint)local_38;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                super_QArrayDataPointer<QDBusMenuEvent>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_a0.displaceTo =
           (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
           ptr;
      local_a0.displaceFrom = local_a0.displaceTo + i;
      local_a0.displaceTo = local_a0.displaceTo + i + 1;
      local_a0.nInserts = 1;
      local_a0.bytes =
           ((this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
            size - i) * 0x48;
      local_a0.data = (QArrayDataPointer<QDBusMenuEvent> *)this;
      memmove(local_a0.displaceTo,local_a0.displaceFrom,local_a0.bytes);
      qVar9 = qStack_60;
      pcVar8 = local_68;
      pQVar7 = pQStack_70;
      (local_a0.displaceFrom)->m_id = local_78;
      pQStack_70 = (QArrayData *)0x0;
      ((local_a0.displaceFrom)->m_eventId).d.d = (Data *)pQVar7;
      local_68 = (char16_t *)0x0;
      ((local_a0.displaceFrom)->m_eventId).d.ptr = pcVar8;
      qStack_60 = 0;
      ((local_a0.displaceFrom)->m_eventId).d.size = qVar9;
      *(undefined8 *)((long)&((local_a0.displaceFrom)->m_data).m_variant.d.data + 0x10) =
           local_58._16_8_;
      *(undefined1 **)&((local_a0.displaceFrom)->m_data).m_variant.d.field_0x18 = puStack_40;
      ((local_a0.displaceFrom)->m_data).m_variant.d.data.shared = local_58.shared;
      *(undefined8 *)((long)&((local_a0.displaceFrom)->m_data).m_variant.d.data + 8) =
           local_58._8_8_;
      local_58._16_8_ = 0;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      puStack_40 = (undefined1 *)0x2;
      (local_a0.displaceFrom)->m_timestamp = (uint)local_38;
      local_a0.displaceFrom = local_a0.displaceFrom + 1;
      Inserter::~Inserter(&local_a0);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (pQStack_70 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_70,2,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
            size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QDBusMenuEvent>).
                      super_QArrayDataPointer<QDBusMenuEvent>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x71c71c71c71c71c7)) {
      pQVar5 = (this->super_QGenericArrayOps<QDBusMenuEvent>).
               super_QArrayDataPointer<QDBusMenuEvent>.ptr + lVar4;
      pQVar5->m_id = args->m_id;
      pDVar6 = (args->m_eventId).d.d;
      (pQVar5->m_eventId).d.d = pDVar6;
      (pQVar5->m_eventId).d.ptr = (args->m_eventId).d.ptr;
      (pQVar5->m_eventId).d.size = (args->m_eventId).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&(pQVar5->m_data).m_variant,&(args->m_data).m_variant);
      pQVar5->m_timestamp = args->m_timestamp;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QDBusMenuEvent *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.ptr
         )) goto LAB_0064ca53;
      pQVar5 = (this->super_QGenericArrayOps<QDBusMenuEvent>).
               super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      pQVar5[-1].m_id = args->m_id;
      pDVar6 = (args->m_eventId).d.d;
      pQVar5[-1].m_eventId.d.d = pDVar6;
      pQVar5[-1].m_eventId.d.ptr = (args->m_eventId).d.ptr;
      pQVar5[-1].m_eventId.d.size = (args->m_eventId).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&pQVar5[-1].m_data.m_variant,&(args->m_data).m_variant);
      pQVar5[-1].m_timestamp = args->m_timestamp;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }